

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O0

void __thiscall ncnn::Deconvolution_x86_avx::Deconvolution_x86_avx(Deconvolution_x86_avx *this)

{
  long *in_RDI;
  Deconvolution *in_stack_fffffffffffffff8;
  
  Deconvolution::Deconvolution(in_stack_fffffffffffffff8);
  *in_RDI = (long)&PTR_create_pipeline_01d3dcf0;
  in_RDI[0xc] = (long)&PTR__Deconvolution_x86_avx_01d3dd70;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  in_RDI[0xb] = 0;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb) = 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  return;
}

Assistant:

Deconvolution_x86_avx::Deconvolution_x86_avx()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    gemm = 0;
}